

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QRegion __thiscall QDockAreaLayout::separatorRegion(QDockAreaLayout *this)

{
  bool bVar1;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *dock;
  int i;
  QRegion *result;
  int local_40;
  QDockAreaLayoutInfo *this_00;
  QRegion local_28;
  undefined1 local_20 [4];
  QRegion local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->sep = (int *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QRegion::QRegion((QRegion *)in_RDI);
  for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x57c411);
    if (!bVar1) {
      _local_20 = separatorRect(local_20._8_8_,local_20._4_4_);
      QRegion::QRegion(&local_10,(QRect *)local_20,Rectangle);
      QRegion::operator|=((QRegion *)in_RDI,(QRegion *)&local_10);
      QRegion::~QRegion(&local_10);
      QDockAreaLayoutInfo::separatorRegion(this_00);
      QRegion::operator|=((QRegion *)in_RDI,(QRegion *)&local_28);
      QRegion::~QRegion(&local_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QRegion)(QRegionData *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QDockAreaLayout::separatorRegion() const
{
    QRegion result;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        result |= separatorRect(i);
        result |= dock.separatorRegion();
    }

    return result;
}